

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxRowRatio(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *lp)

{
  uint *puVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar5;
  Real a;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  Item *pIVar10;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mini;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_178;
  double local_140;
  cpp_dec_float<50U,_int,_void> local_138;
  cpp_dec_float<50U,_int,_void> local_f8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c0;
  long local_b8;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_b0;
  Item *local_a8;
  long local_a0;
  cpp_dec_float<50U,_int,_void> local_98;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  uint auStack_40 [2];
  uint local_38 [2];
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  local_b0 = this;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_140 = *(double *)(in_FS_OFFSET + -8);
    local_b8 = 0;
    local_c0 = lp;
    do {
      pIVar10 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[local_b8].idx;
      ::soplex::infinity::__tls_init();
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems._24_5_ = 0;
      local_138.data._M_elems[7]._1_3_ = 0;
      local_138.data._M_elems._32_5_ = 0;
      local_138.data._M_elems[9]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_138,local_140);
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_f8,0.0);
      if (0 < (pIVar10->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar8 = 0x34;
        lVar9 = 0;
        local_a8 = pIVar10;
        do {
          pNVar4 = (pIVar10->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          iVar7 = *(int *)((long)&(pNVar4->val).m_backend.data + lVar8 + -0xc);
          local_1b8.neg = *(bool *)((long)&(pNVar4->val).m_backend.data + lVar8 + -8);
          fVar2 = *(fpclass_type *)((long)&(pNVar4->val).m_backend.data + lVar8 + -4);
          iVar3 = *(int32_t *)((long)&(pNVar4->val).m_backend.data + lVar8);
          puVar1 = (uint *)((long)&(pNVar4->val).m_backend.data + lVar8 + -0x34);
          local_1b8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_1b8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pNVar4->val).m_backend.data + lVar8 + -0x24);
          local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_1b8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_1b8.data._M_elems._32_8_ =
               *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar8 + -0x14);
          if ((local_1b8.neg == true) &&
             (local_1b8.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
            local_1b8.neg = false;
          }
          bVar5 = local_1b8.neg;
          this_00 = (local_b0->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (local_b0->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          local_1b8.exp = iVar7;
          local_1b8.fpclass = fVar2;
          local_1b8.prec_elem = iVar3;
          local_a0 = lVar9;
          local_58 = (uint  [2])local_1b8.data._M_elems._0_8_;
          auStack_50 = (uint  [2])local_1b8.data._M_elems._8_8_;
          local_48 = (uint  [2])local_1b8.data._M_elems._16_8_;
          auStack_40 = (uint  [2])local_1b8.data._M_elems._24_8_;
          local_38 = (uint  [2])local_1b8.data._M_elems._32_8_;
          a = Tolerances::epsilon(this_00);
          local_98.data._M_elems[8] = local_38[0];
          local_98.data._M_elems[9] = local_38[1];
          local_98.data._M_elems[4] = local_48[0];
          local_98.data._M_elems[5] = local_48[1];
          local_98.data._M_elems[6] = auStack_40[0];
          local_98.data._M_elems[7] = auStack_40[1];
          local_98.data._M_elems[0] = local_58[0];
          local_98.data._M_elems[1] = local_58[1];
          uVar6 = local_98.data._M_elems._0_8_;
          local_98.data._M_elems[2] = auStack_50[0];
          local_98.data._M_elems[3] = auStack_50[1];
          local_98.neg = bVar5;
          if ((bVar5 != false) &&
             (local_98.data._M_elems[0] = local_58[0],
             local_98.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
            local_98.neg = (bool)(bVar5 ^ 1);
          }
          bVar5 = false;
          local_98.data._M_elems._0_8_ = uVar6;
          local_98.exp = iVar7;
          local_98.fpclass = fVar2;
          local_98.prec_elem = iVar3;
          if ((fVar2 != cpp_dec_float_NaN) && (!NAN(a))) {
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems._32_5_ = 0;
            local_178.data._M_elems[9]._1_3_ = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_178,a);
            iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_98,&local_178);
            bVar5 = iVar7 < 1;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          lVar9 = local_a0;
          pIVar10 = local_a8;
          if (!bVar5) {
            if (((local_1b8.fpclass != cpp_dec_float_NaN) &&
                (local_138.fpclass != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1b8,&local_138), iVar7 < 0)) {
              local_138.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
              local_138.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
              local_138.data._M_elems[4] = local_1b8.data._M_elems[4];
              local_138.data._M_elems[5] = local_1b8.data._M_elems[5];
              local_138.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
              local_138.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
              local_138.data._M_elems[0] = local_1b8.data._M_elems[0];
              local_138.data._M_elems[1] = local_1b8.data._M_elems[1];
              local_138.data._M_elems[2] = local_1b8.data._M_elems[2];
              local_138.data._M_elems[3] = local_1b8.data._M_elems[3];
              local_138.exp = local_1b8.exp;
              local_138.neg = local_1b8.neg;
              local_138.prec_elem = local_1b8.prec_elem;
              local_138.fpclass = local_1b8.fpclass;
            }
            if (((local_1b8.fpclass != cpp_dec_float_NaN) && (local_f8.fpclass != cpp_dec_float_NaN)
                ) && (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_1b8,&local_f8), 0 < iVar7)) {
              local_f8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
              local_f8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
              local_f8.data._M_elems[4] = local_1b8.data._M_elems[4];
              local_f8.data._M_elems[5] = local_1b8.data._M_elems[5];
              local_f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
              local_f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
              local_f8.data._M_elems[0] = local_1b8.data._M_elems[0];
              local_f8.data._M_elems[1] = local_1b8.data._M_elems[1];
              local_f8.data._M_elems[2] = local_1b8.data._M_elems[2];
              local_f8.data._M_elems[3] = local_1b8.data._M_elems[3];
              local_f8.exp = local_1b8.exp;
              local_f8.neg = local_1b8.neg;
              local_f8.prec_elem = local_1b8.prec_elem;
              local_f8.fpclass = local_1b8.fpclass;
            }
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x3c;
        } while (lVar9 < (pIVar10->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused);
      }
      ::soplex::infinity::__tls_init();
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems._24_5_ = 0;
      local_178.data._M_elems[7]._1_3_ = 0;
      local_178.data._M_elems._32_5_ = 0;
      local_178.data._M_elems[9]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_178,local_140);
      lp = local_c0;
      if (((local_138.fpclass == cpp_dec_float_NaN) || (local_178.fpclass == cpp_dec_float_NaN)) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_138,&local_178), iVar7 != 0)) {
        local_178.fpclass = cpp_dec_float_finite;
        local_178.prec_elem = 10;
        local_178.data._M_elems[0] = 0;
        local_178.data._M_elems[1] = 0;
        local_178.data._M_elems[2] = 0;
        local_178.data._M_elems[3] = 0;
        local_178.data._M_elems[4] = 0;
        local_178.data._M_elems[5] = 0;
        local_178.data._M_elems._24_5_ = 0;
        local_178.data._M_elems[7]._1_3_ = 0;
        local_178.data._M_elems._32_5_ = 0;
        local_178.data._M_elems[9]._1_3_ = 0;
        local_178.exp = 0;
        local_178.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_178,&local_f8,&local_138);
        if (((local_178.fpclass != cpp_dec_float_NaN) &&
            ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_178,&__return_storage_ptr__->m_backend), 0 < iVar7)) {
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
               CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
               local_178.data._M_elems._16_8_;
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
               CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
          *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
               local_178.data._M_elems._0_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
               local_178.data._M_elems._8_8_;
          (__return_storage_ptr__->m_backend).exp = local_178.exp;
          (__return_storage_ptr__->m_backend).neg = local_178.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_178.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_178.prec_elem;
        }
      }
      local_b8 = local_b8 + 1;
    } while (local_b8 <
             (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::maxRowRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& vec  = lp.rowVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}